

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

Tagger * MeCab::createTagger(int argc,char **argv)

{
  ModelImpl *pMVar1;
  int iVar2;
  TaggerImpl *this;
  ModelImpl *this_00;
  undefined4 extraout_var;
  
  this = (TaggerImpl *)operator_new(0x60);
  anon_unknown_0::TaggerImpl::TaggerImpl(this);
  this_00 = (ModelImpl *)operator_new(0x30);
  anon_unknown_0::ModelImpl::ModelImpl(this_00);
  pMVar1 = (this->model_).ptr_;
  if (pMVar1 != (ModelImpl *)0x0) {
    (*(pMVar1->super_Model)._vptr_Model[7])();
  }
  (this->model_).ptr_ = this_00;
  iVar2 = anon_unknown_0::ModelImpl::open(this_00,argc,(int)argv);
  pMVar1 = (this->model_).ptr_;
  if ((char)iVar2 == '\0') {
    if (pMVar1 != (ModelImpl *)0x0) {
      (*(pMVar1->super_Model)._vptr_Model[7])();
    }
    (this->model_).ptr_ = (ModelImpl *)0x0;
    iVar2 = (*(this->super_Tagger)._vptr_Tagger[0x1b])(this);
    setGlobalError((char *)CONCAT44(extraout_var,iVar2));
    (*(this->super_Tagger)._vptr_Tagger[0x1d])(this);
    this = (TaggerImpl *)0x0;
  }
  else {
    this->current_model_ = pMVar1;
    this->request_type_ = pMVar1->request_type_;
    this->theta_ = pMVar1->theta_;
  }
  return &this->super_Tagger;
}

Assistant:

Tagger *createTagger(int argc, char **argv) {
  TaggerImpl *tagger = new TaggerImpl();
  if (!tagger->open(argc, argv)) {
    setGlobalError(tagger->what());
    delete tagger;
    return 0;
  }
  return tagger;
}